

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.h
# Opt level: O0

error_code * __thiscall
rest_rpc::rpc_service::connection::remote_address_abi_cxx11_(connection *this)

{
  bool bVar1;
  long in_RSI;
  error_code *in_RDI;
  endpoint_type endpoint;
  error_code ec;
  basic_endpoint<asio::ip::tcp> *in_stack_ffffffffffffff58;
  error_code *in_stack_ffffffffffffff60;
  allocator *paVar2;
  address *in_stack_ffffffffffffff68;
  error_code *peVar3;
  allocator local_55 [29];
  error_code local_38 [2];
  allocator local_11 [17];
  
  peVar3 = in_RDI;
  if ((*(byte *)(in_RSI + 0x148) & 1) == 0) {
    std::error_code::error_code(in_stack_ffffffffffffff60);
    asio::basic_socket<asio::ip::tcp,_asio::any_io_executor>::remote_endpoint
              ((basic_socket<asio::ip::tcp,_asio::any_io_executor> *)peVar3,in_RDI);
    bVar1 = std::error_code::operator_cast_to_bool(local_38);
    if (bVar1) {
      paVar2 = local_55;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)in_RDI,"",paVar2);
      std::allocator<char>::~allocator((allocator<char> *)local_55);
    }
    else {
      asio::ip::basic_endpoint<asio::ip::tcp>::address(in_stack_ffffffffffffff58);
      asio::ip::address::to_string_abi_cxx11_(in_stack_ffffffffffffff68);
    }
  }
  else {
    paVar2 = local_11;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"",paVar2);
    std::allocator<char>::~allocator((allocator<char> *)local_11);
  }
  return peVar3;
}

Assistant:

std::string remote_address() const {
    if (has_closed_) {
      return "";
    }

    asio::error_code ec;
    auto endpoint = socket_.remote_endpoint(ec);
    if (ec) {
      return "";
    }
    return endpoint.address().to_string();
  }